

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void learn(log_multi *b,single_learner *base,example *ec)

{
  undefined4 uVar1;
  bool bVar2;
  node *pnVar3;
  single_learner *in_RDX;
  log_multi *in_RSI;
  long in_RDI;
  uint32_t *unaff_retaddr;
  uint32_t *in_stack_00000008;
  uint32_t depth;
  uint32_t cn;
  single_learner *in_stack_00000018;
  uint32_t class_index;
  uint32_t start_pred;
  label_t mc;
  uint32_t in_stack_00000124;
  uint32_t *in_stack_00000128;
  uint32_t *in_stack_00000130;
  log_multi *in_stack_00000138;
  uint local_38;
  uint32_t node;
  undefined4 uVar4;
  undefined4 uVar5;
  example *in_stack_ffffffffffffffe0;
  undefined8 uVar6;
  
  if ((*(int *)(in_RDX + 0x6828) == -1) || ((*(byte *)(in_RDI + 0x38) & 1) != 0)) {
    predict(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  }
  if (*(int *)(in_RDX + 0x6828) != -1) {
    uVar6 = *(undefined8 *)(in_RDX + 0x6828);
    uVar1 = *(undefined4 *)(in_RDX + 0x6850);
    node = 0x7f7fffff;
    uVar4 = 0;
    uVar5 = 0;
    *(undefined8 *)(in_RDX + 0x6828) = 0x7f7fffff;
    *(undefined4 *)(in_RDX + 0x6830) = 0;
    local_38 = 0;
    while( true ) {
      bVar2 = children(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124);
      if (!bVar2) break;
      train_node(_class_index,in_stack_00000018,_cn,in_stack_00000008,unaff_retaddr,
                 (uint32_t)((ulong)in_RDI >> 0x20));
      pnVar3 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_38);
      local_38 = descend(pnVar3,*(float *)(in_RDX + 0x6850));
    }
    pnVar3 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_38);
    pnVar3->min_count = pnVar3->min_count + 1;
    update_min_count((log_multi *)CONCAT44(uVar5,uVar4),node);
    *(undefined4 *)(in_RDX + 0x6850) = uVar1;
    *(undefined8 *)(in_RDX + 0x6828) = uVar6;
  }
  return;
}

Assistant:

void learn(log_multi& b, single_learner& base, example& ec)
{
  //    verify_min_dfs(b, b.nodes[0]);
  if (ec.l.multi.label == (uint32_t)-1 || b.progress)
    predict(b, base, ec);

  if (ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    MULTICLASS::label_t mc = ec.l.multi;
    uint32_t start_pred = ec.pred.multiclass;

    uint32_t class_index = 0;
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    uint32_t cn = 0;
    uint32_t depth = 0;
    while (children(b, cn, class_index, mc.label))
    {
      train_node(b, base, ec, cn, class_index, depth);
      cn = descend(b.nodes[cn], ec.pred.scalar);
      depth++;
    }

    b.nodes[cn].min_count++;
    update_min_count(b, cn);
    ec.pred.multiclass = start_pred;
    ec.l.multi = mc;
  }
}